

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  short sVar2;
  jpeg_entropy_decoder *pjVar3;
  int *piVar4;
  JBLOCKROW paJVar5;
  jpeg_source_mgr *pjVar6;
  d_derived_tbl *htbl;
  jpeg_error_mgr *pjVar7;
  boolean bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  _func_void_j_decompress_ptr *get_buffer;
  uint nbits;
  int iVar15;
  int iVar16;
  int bits_left;
  uint uVar17;
  uint local_1a0;
  uint local_19c;
  bitread_working_state br_state;
  int newnz_pos [64];
  
  pjVar3 = cinfo->entropy;
  if (((cinfo->restart_interval != 0) && (*(int *)&pjVar3[3].decode_mcu == 0)) &&
     (bVar8 = process_restart(cinfo), bVar8 == 0)) {
    return 0;
  }
  if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
    bVar1 = (byte)cinfo->Al;
    uVar14 = 1 << (bVar1 & 0x1f);
    uVar9 = -1 << (bVar1 & 0x1f);
    iVar12 = cinfo->Se;
    piVar4 = cinfo->natural_order;
    br_state.next_input_byte = cinfo->src->next_input_byte;
    br_state.bytes_in_buffer = cinfo->src->bytes_in_buffer;
    get_buffer = pjVar3[1].start_pass;
    uVar11 = (ulong)*(uint *)&pjVar3[1].decode_mcu;
    local_19c = *(uint *)&pjVar3[2].start_pass;
    paJVar5 = *MCU_data;
    iVar15 = cinfo->Ss;
    local_1a0 = 0;
    br_state.cinfo = cinfo;
    if (local_19c == 0) {
      htbl = (d_derived_tbl *)pjVar3[6].start_pass;
      local_1a0 = 0;
      while (uVar17 = (uint)uVar11, iVar15 <= iVar12) {
        if ((int)uVar17 < 8) {
          bVar8 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,uVar17,0);
          if (bVar8 == 0) goto LAB_0023ee98;
          iVar16 = 1;
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          uVar17 = br_state.bits_left;
          if (7 < br_state.bits_left) goto LAB_0023ec5f;
LAB_0023ec8a:
          uVar10 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,uVar17,htbl,iVar16);
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          uVar17 = br_state.bits_left;
          if ((int)uVar10 < 0) goto LAB_0023ee98;
        }
        else {
LAB_0023ec5f:
          uVar11 = (long)get_buffer >> ((char)uVar17 - 8U & 0x3f) & 0xff;
          if (htbl->look_nbits[uVar11] == 0) {
            iVar16 = 9;
            goto LAB_0023ec8a;
          }
          uVar10 = (uint)htbl->look_sym[uVar11];
          uVar17 = uVar17 - htbl->look_nbits[uVar11];
        }
        uVar11 = (ulong)uVar17;
        nbits = uVar10 >> 4;
        if ((uVar10 & 0xf) == 0) {
          local_19c = 0;
          if (nbits != 0xf) {
            local_19c = 1 << ((byte)nbits & 0x1f);
            if (uVar10 < 0x10) goto LAB_0023eb54;
            if (((int)uVar17 < (int)nbits) &&
               (bVar8 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,uVar17,nbits),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               uVar17 = br_state.bits_left, bVar8 == 0)) goto LAB_0023ee98;
            uVar17 = uVar17 - nbits;
            uVar11 = (ulong)uVar17;
            local_19c = local_19c +
                        ((uint)((long)get_buffer >> ((byte)uVar17 & 0x3f)) & bmask[nbits]);
            if (local_19c != 0) goto LAB_0023eb54;
            iVar12 = 0;
            goto LAB_0023ebda;
          }
        }
        else {
          if ((uVar10 & 0xf) != 1) {
            pjVar7 = cinfo->err;
            pjVar7->msg_code = 0x79;
            (*pjVar7->emit_message)((j_common_ptr)cinfo,-1);
          }
          if (((int)uVar17 < 1) &&
             (bVar8 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,uVar17,1),
             get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
             uVar17 = br_state.bits_left, bVar8 == 0)) goto LAB_0023ee98;
          uVar11 = (ulong)(uVar17 - 1);
          local_19c = uVar14;
          if (((ulong)get_buffer >> (uVar11 & 0x3f) & 1) == 0) {
            local_19c = uVar9;
          }
        }
        lVar13 = (long)iVar15 + -1;
        do {
          bits_left = (int)uVar11;
          iVar16 = piVar4[lVar13 + 1];
          if ((*paJVar5)[iVar16] == 0) {
            iVar16 = iVar15;
            if ((int)nbits < 1) break;
            nbits = nbits - 1;
          }
          else {
            if ((bits_left < 1) &&
               (bVar8 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,1),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar8 == 0)) goto LAB_0023ee98;
            uVar11 = (ulong)(bits_left - 1);
            if ((((ulong)get_buffer >> (uVar11 & 0x3f) & 1) != 0) &&
               (sVar2 = (*paJVar5)[iVar16], (uVar14 & (int)sVar2) == 0)) {
              uVar17 = uVar14;
              if (sVar2 < 0) {
                uVar17 = uVar9;
              }
              (*paJVar5)[iVar16] = (short)uVar17 + sVar2;
            }
          }
          iVar15 = iVar15 + 1;
          lVar13 = lVar13 + 1;
          iVar16 = iVar12 + 1;
        } while (lVar13 < iVar12);
        if (local_19c != 0) {
          iVar15 = piVar4[iVar16];
          (*paJVar5)[iVar15] = (JCOEF)local_19c;
          lVar13 = (long)(int)local_1a0;
          local_1a0 = local_1a0 + 1;
          newnz_pos[lVar13] = iVar15;
        }
        iVar15 = iVar16 + 1;
      }
      iVar12 = 0;
    }
    else {
LAB_0023eb54:
      for (lVar13 = (long)iVar15; uVar17 = (uint)uVar11, lVar13 <= iVar12; lVar13 = lVar13 + 1) {
        iVar15 = piVar4[lVar13];
        if ((*paJVar5)[iVar15] != 0) {
          if (((int)uVar17 < 1) &&
             (bVar8 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,uVar17,1),
             get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
             uVar17 = br_state.bits_left, bVar8 == 0)) {
LAB_0023ee98:
            for (uVar11 = (ulong)local_1a0; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              (*paJVar5)[newnz_pos[uVar11 - 1]] = 0;
            }
            return 0;
          }
          uVar11 = (ulong)(uVar17 - 1);
          if ((((ulong)get_buffer >> (uVar11 & 0x3f) & 1) != 0) &&
             (sVar2 = (*paJVar5)[iVar15], (uVar14 & (int)sVar2) == 0)) {
            uVar17 = uVar14;
            if (sVar2 < 0) {
              uVar17 = uVar9;
            }
            (*paJVar5)[iVar15] = (short)uVar17 + sVar2;
          }
        }
      }
      iVar12 = local_19c + -1;
    }
LAB_0023ebda:
    pjVar6 = cinfo->src;
    pjVar6->next_input_byte = br_state.next_input_byte;
    pjVar6->bytes_in_buffer = br_state.bytes_in_buffer;
    pjVar3[1].start_pass = get_buffer;
    *(uint *)&pjVar3[1].decode_mcu = uVar17;
    *(int *)&pjVar3[2].start_pass = iVar12;
  }
  *(int *)&pjVar3[3].decode_mcu = *(int *)&pjVar3[3].decode_mcu + -1;
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, p1, m1;
  const int * natural_order;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    p1 = 1 << cinfo->Al;	/* 1 in the bit position being coded */
    m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */
    natural_order = cinfo->natural_order;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
	r = s >> 4;
	s &= 15;
	if (s) {
	  if (s != 1)		/* size of new coef should always be 1 */
	    WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1))
	    s = p1;		/* newly nonzero coef is positive */
	  else
	    s = m1;		/* newly nonzero coef is negative */
	} else {
	  if (r != 15) {
	    EOBRUN = 1 << r;	/* EOBr, run length is 2^r + appended bits */
	    if (r) {
	      CHECK_BIT_BUFFER(br_state, r, goto undoit);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    break;		/* rest of block is handled by EOB logic */
	  }
	  /* note s = 0 for processing ZRL */
	}
	/* Advance over already-nonzero coefs and r still-zero coefs,
	 * appending correction bits to the nonzeroes.  A correction bit is 1
	 * if the absolute value of the coefficient must be increased.
	 */
	do {
	  thiscoef = *block + natural_order[k];
	  if (*thiscoef != 0) {
	    CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	    if (GET_BITS(1)) {
	      if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
		if (*thiscoef >= 0)
		  *thiscoef += p1;
		else
		  *thiscoef += m1;
	      }
	    }
	  } else {
	    if (--r < 0)
	      break;		/* reached target zero coefficient */
	  }
	  k++;
	} while (k <= Se);
	if (s) {
	  int pos = natural_order[k];
	  /* Output newly nonzero coefficient */
	  (*block)[pos] = (JCOEF) s;
	  /* Remember its position in case we have to suspend */
	  newnz_pos[num_newnz++] = pos;
	}
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
	thiscoef = *block + natural_order[k];
	if (*thiscoef != 0) {
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1)) {
	    if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
	      if (*thiscoef >= 0)
		*thiscoef += p1;
	      else
		*thiscoef += m1;
	    }
	  }
	}
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}